

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char.c
# Opt level: O1

token * dmrC_get_string_constant(dmr_C *C,token *token,expression *expr)

{
  uint uVar1;
  position pVar2;
  long lVar3;
  uint *puVar4;
  string *psVar5;
  uint *end;
  position pVar6;
  position pVar7;
  ulong uVar8;
  int iVar9;
  bool bVar10;
  undefined1 local_2068 [8];
  char buffer [8191];
  undefined1 local_44 [4];
  int local_40;
  uint v;
  dmr_C *local_38;
  
  psVar5 = (token->field_2).string;
  pVar2 = (position)token->next;
  v = (uint)(((ulong)token->pos & 0x3f) == 0x10);
  pVar6 = (position)0x0;
  do {
    if ((*(uint *)pVar2 & 0x3f) == 0xf) {
LAB_00107b62:
      pVar2 = *(position *)((long)pVar2 + 8);
      pVar7 = pVar6;
    }
    else {
      pVar7 = pVar2;
      if ((*(uint *)pVar2 & 0x3f) == 0x10) {
        v = 1;
        goto LAB_00107b62;
      }
    }
    pVar6 = pVar7;
    if (pVar7 != (position)0x0) {
      lVar3 = 0x30;
      if (v == 0) {
        lVar3 = 0x18;
      }
      local_38 = C;
      if (pVar7 == (position)token) {
        bVar10 = true;
        uVar8 = 0;
      }
      else {
        local_40 = *(int *)((long)&C->target->size_t_ctype + lVar3);
        iVar9 = 0;
        uVar8 = 0;
        do {
          puVar4 = *(uint **)((long)token + 0x10);
          if (1 < (*puVar4 & 0x7fffffff)) {
            end = (uint *)((long)puVar4 + (ulong)(*puVar4 & 0x7fffffff) + 3);
            puVar4 = puVar4 + 1;
            uVar8 = (ulong)(int)uVar8;
            unique0x10000204 = (position)token;
            do {
              uVar1 = *puVar4;
              puVar4 = (uint *)parse_escape(local_38,(char *)puVar4,(uint *)local_44,(char *)end,
                                            local_40,*(position *)stack0xffffffffffffff98);
              if ((long)uVar8 < 0x1fff) {
                local_2068[uVar8] = local_44[0];
              }
              iVar9 = iVar9 + (uint)((char)uVar1 == '\\');
              uVar8 = uVar8 + 1;
              token = (token *)stack0xffffffffffffff98;
            } while (puVar4 < end);
          }
          token = *(token **)((long)token + 8);
        } while ((position)token != pVar7);
        bVar10 = iVar9 == 0;
      }
      iVar9 = (int)uVar8;
      if (0x1fff < iVar9) {
        dmrC_warning(local_38,token->pos,"trying to concatenate %d-character string (%d bytes max)",
                     uVar8 & 0xffffffff,0x1fff);
        iVar9 = 0x1fff;
      }
      if ((!bVar10) || ((int)((uint)*psVar5 & 0x7fffffff) <= iVar9)) {
        if (((int)*psVar5 < 0) || ((int)*psVar5 <= iVar9)) {
          psVar5 = (string *)dmrC_allocator_allocate(&local_38->string_allocator,(long)(iVar9 + 1));
        }
        *psVar5 = (string)((uint)*psVar5 & 0x80000000 | iVar9 + 1U & 0x7fffffff);
        memcpy(psVar5 + 1,local_2068,(long)iVar9);
        *(undefined1 *)((long)&psVar5[1].field_0x0 + (long)iVar9) = 0;
      }
      (expr->field_5).field_2.string = psVar5;
      (expr->field_5).field_15.idx_from = v;
      return (token *)(position)token;
    }
  } while( true );
}

Assistant:

struct token *dmrC_get_string_constant(struct dmr_C *C, struct token *token, struct expression *expr)
{
	struct string *string = token->string;
	struct token *next = token->next, *done = NULL;
	int stringtype = dmrC_token_type(token);
	int is_wide = stringtype == TOKEN_WIDE_STRING;
	char buffer[MAX_STRING];
	int len = 0;
	int bits;
	int esc_count = 0;

	while (!done) {
		switch (dmrC_token_type(next)) {
		case TOKEN_WIDE_STRING:
			is_wide = 1;
		case TOKEN_STRING:
			next = next->next;
			break;
		default:
			done = next;
		}
	}
	bits = is_wide ? C->target->bits_in_wchar : C->target->bits_in_char;
	while (token != done) {
		unsigned v;
		const char *p = token->string->data;
		const char *end = p + token->string->length - 1;
		while (p < end) {
			if (*p == '\\')
				esc_count++;
			p = parse_escape(C, p, &v, end, bits, token->pos);
			if (len < MAX_STRING)
				buffer[len] = v;
			len++;
		}
		token = token->next;
	}
	if (len > MAX_STRING) {
		dmrC_warning(C, token->pos, "trying to concatenate %d-character string (%d bytes max)", len, MAX_STRING);
		len = MAX_STRING;
	}

	if (esc_count || len >= (int)string->length) {
		if (string->immutable || len >= string->length)	/* can't cannibalize */
			string = (struct string *)dmrC_allocator_allocate(&C->string_allocator, len+1);
		string->length = len+1;
		memcpy(string->data, buffer, len);
		string->data[len] = '\0';
	}
	expr->string = string;
	expr->wide = is_wide;
	return token;
}